

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::ShutdownedWrite::pumpTo
          (ShutdownedWrite *this,AsyncOutputStream *output,uint64_t amount)

{
  constPromise<unsigned_long,_0UL>();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
      return constPromise<uint64_t, 0>();
    }